

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O1

void __thiscall
absl::
InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
::~InlinedVector(InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
                 *this)

{
  ulong uVar1;
  
  uVar1 = (this->allocator_and_tag_).tag_.size_;
  if ((uVar1 & 1) == 0) {
    if (1 < uVar1) {
      memset(&this->rep_,0xab,(uVar1 >> 1) << 4);
    }
  }
  else {
    if (1 < uVar1) {
      memset(*(void **)((long)&this->rep_ + 8),0xab,(uVar1 >> 1) << 4);
    }
    operator_delete(*(void **)((long)&this->rep_ + 8));
  }
  (this->allocator_and_tag_).tag_.size_ = 0;
  return;
}

Assistant:

~InlinedVector() { clear(); }